

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O1

bool __thiscall
Lib::
DHMap<unsigned_int,_Lib::Stack<std::pair<Kernel::SymbolType,_unsigned_int>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
::insert(DHMap<unsigned_int,_Lib::Stack<std::pair<Kernel::SymbolType,_unsigned_int>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
         *this,uint key,Stack<std::pair<Kernel::SymbolType,_unsigned_int>_> *val)

{
  uint uVar1;
  size_t sVar2;
  pair<Kernel::SymbolType,_unsigned_int> *ppVar3;
  Entry *pEVar4;
  uint uVar5;
  uint uVar6;
  uint local_14;
  
  local_14 = key;
  if (this->_nextExpansionOccupancy <= this->_deleted + this->_size) {
    expand(this);
  }
  pEVar4 = findEntryToInsert(this,&local_14);
  uVar6 = (uint)(pEVar4->field_0)._infoData >> 2;
  uVar1 = this->_timestamp;
  uVar5 = (pEVar4->field_0)._infoData & 1;
  if (uVar6 != uVar1 || uVar5 != 0) {
    if (uVar6 == uVar1) {
      this->_deleted = this->_deleted + -1;
    }
    else {
      (pEVar4->field_0)._infoData = uVar5 + uVar1 * 4;
    }
    *(byte *)&pEVar4->field_0 = *(byte *)&pEVar4->field_0 & 0xfe;
    pEVar4->_key = local_14;
    sVar2 = (pEVar4->_val)._capacity;
    (pEVar4->_val)._capacity = val->_capacity;
    val->_capacity = sVar2;
    ppVar3 = (pEVar4->_val)._cursor;
    (pEVar4->_val)._cursor = val->_cursor;
    val->_cursor = ppVar3;
    ppVar3 = (pEVar4->_val)._end;
    (pEVar4->_val)._end = val->_end;
    val->_end = ppVar3;
    ppVar3 = (pEVar4->_val)._stack;
    (pEVar4->_val)._stack = val->_stack;
    val->_stack = ppVar3;
    this->_size = this->_size + 1;
  }
  return uVar6 != uVar1 || uVar5 != 0;
}

Assistant:

bool insert(Key key, Val val)
  {
    ensureExpanded();
    Entry* e=findEntryToInsert(key);
    bool exists = e->_info.timestamp==_timestamp && !e->_info.deleted;
    if(!exists) {
      if(e->_info.timestamp!=_timestamp) {
	e->_info.timestamp=_timestamp;
	//no collision has occured on this entry while this _timestamp is set
	e->_info.collision=0;
      } else {
	ASS(e->_info.deleted);
	_deleted--;
      }
      e->_info.deleted=0;
      e->_key = std::move(key);
      e->_val = std::move(val);
      _size++;
    }
    return !exists;

  }